

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
          (SourceLocationCommentPrinter *this,string *output)

{
  ulong uVar1;
  size_type sVar2;
  reference comment_text;
  string local_70;
  string local_40;
  int local_1c;
  string *psStack_18;
  int i;
  string *output_local;
  SourceLocationCommentPrinter *this_local;
  
  if ((this->have_source_loc_ & 1U) != 0) {
    psStack_18 = output;
    output_local = (string *)this;
    for (local_1c = 0; uVar1 = (ulong)local_1c,
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&(this->source_loc_).leading_detached_comments), uVar1 < sVar2;
        local_1c = local_1c + 1) {
      comment_text = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&(this->source_loc_).leading_detached_comments,(long)local_1c);
      FormatComment(&local_40,this,comment_text);
      std::__cxx11::string::operator+=((string *)psStack_18,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::operator+=((string *)psStack_18,"\n");
    }
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      FormatComment(&local_70,this,&(this->source_loc_).leading_comments);
      std::__cxx11::string::operator+=((string *)psStack_18,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  return;
}

Assistant:

void AddPreComment(string* output) {
    if (have_source_loc_) {
      // Detached leading comments.
      for (int i = 0 ; i < source_loc_.leading_detached_comments.size(); ++i) {
        *output += FormatComment(source_loc_.leading_detached_comments[i]);
        *output += "\n";
      }
      // Attached leading comments.
      if (!source_loc_.leading_comments.empty()) {
        *output += FormatComment(source_loc_.leading_comments);
      }
    }
  }